

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O2

void __thiscall
vkt::pipeline::anon_unknown_0::SpecConstantTest::initPrograms
          (SpecConstantTest *this,SourceCollections *programCollection)

{
  VkShaderStageFlagBits VVar1;
  VkShaderStageFlagBits VVar2;
  VkShaderStageFlagBits VVar3;
  char *pcVar4;
  ostream *poVar5;
  ProgramSources *pPVar6;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_00;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_01;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_02;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_03;
  vector<vkt::pipeline::(anonymous_namespace)::SpecConstant,_std::allocator<vkt::pipeline::(anonymous_namespace)::SpecConstant>_>
  *specConstants_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  undefined1 local_200 [44];
  allocator<char> local_1d4;
  allocator<char> local_1d3;
  allocator<char> local_1d2;
  allocator<char> local_1d1;
  allocator<char> local_1d0;
  allocator<char> local_1cf;
  allocator<char> local_1ce;
  allocator<char> local_1cd;
  allocator<char> local_1cc;
  allocator<char> local_1cb;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  allocator<char> local_1c8;
  allocator<char> local_1c7;
  allocator<char> local_1c6;
  allocator<char> local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  ostringstream src;
  
  VVar1 = this->m_stage;
  VVar3 = VVar1 | (VK_SHADER_STAGE_FRAGMENT_BIT|VK_SHADER_STAGE_VERTEX_BIT);
  if ((VVar1 & VK_SHADER_STAGE_ALL_GRAPHICS) == 0) {
    VVar3 = VVar1;
  }
  VVar2 = VVar3 | (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|
                  VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
  if ((VVar3 & (VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT|VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT
               )) == 0) {
    VVar2 = VVar3;
  }
  if ((VVar2 & VK_SHADER_STAGE_VERTEX_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar5 = std::operator<<((ostream *)&src,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(location = 0) in highp vec4 position;\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"out ");
    poVar5 = std::operator<<(poVar5,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar5 = std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<(poVar5,"\n");
    if (VVar1 == VK_SHADER_STAGE_VERTEX_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"",&local_1c1);
    }
    poVar5 = std::operator<<(poVar5,(string *)local_200);
    if (VVar1 == VK_SHADER_STAGE_VERTEX_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_1c2);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    if (VVar1 == VK_SHADER_STAGE_VERTEX_BIT) {
      std::operator+(&local_240,&(this->m_caseDef).globalCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_1c3);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_240);
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    if (VVar1 == VK_SHADER_STAGE_VERTEX_BIT) {
      std::operator+(&local_1c0,&(this->m_caseDef).mainCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c4);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    poVar5 = std::operator<<(poVar5,"    gl_Position = position;\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"vert",(allocator<char> *)&local_1c0);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    glu::VertexSource::VertexSource((VertexSource *)local_200,&local_240);
    glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_200);
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar2 & VK_SHADER_STAGE_FRAGMENT_BIT) != 0) {
    VVar1 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar5 = std::operator<<((ostream *)&src,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(location = 0) out highp vec4 fragColor;\n");
    poVar5 = std::operator<<(poVar5,"\n");
    if (VVar1 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_00);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"",&local_1c5);
    }
    poVar5 = std::operator<<(poVar5,(string *)local_200);
    if (VVar1 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_1c6);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    if (VVar1 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      std::operator+(&local_240,&(this->m_caseDef).globalCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_1c7);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_240);
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    if (VVar1 == VK_SHADER_STAGE_FRAGMENT_BIT) {
      std::operator+(&local_1c0,&(this->m_caseDef).mainCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1c8);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    poVar5 = std::operator<<(poVar5,"    fragColor = vec4(1.0, 1.0, 0.0, 1.0);\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"frag",(allocator<char> *)&local_1c0);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    glu::FragmentSource::FragmentSource((FragmentSource *)local_200,&local_240);
    glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_200);
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar2 & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0) {
    VVar1 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar5 = std::operator<<((ostream *)&src,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(vertices = 3) out;\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"in ");
    poVar5 = std::operator<<(poVar5,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar5 = std::operator<<(poVar5," gl_in[gl_MaxPatchVertices];\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"out ");
    poVar5 = std::operator<<(poVar5,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar5 = std::operator<<(poVar5," gl_out[];\n");
    poVar5 = std::operator<<(poVar5,"\n");
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_01);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"",&local_1c9);
    }
    poVar5 = std::operator<<(poVar5,(string *)local_200);
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_1ca);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      std::operator+(&local_240,&(this->m_caseDef).globalCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_1cb);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_240);
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) {
      std::operator+(&local_1c0,&(this->m_caseDef).mainCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1cc);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    poVar5 = std::operator<<(poVar5,
                             "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
                            );
    poVar5 = std::operator<<(poVar5,"    if (gl_InvocationID == 0)\n");
    poVar5 = std::operator<<(poVar5,"    {\n");
    poVar5 = std::operator<<(poVar5,"        gl_TessLevelInner[0] = 3;\n");
    poVar5 = std::operator<<(poVar5,"        gl_TessLevelOuter[0] = 2;\n");
    poVar5 = std::operator<<(poVar5,"        gl_TessLevelOuter[1] = 2;\n");
    poVar5 = std::operator<<(poVar5,"        gl_TessLevelOuter[2] = 2;\n");
    poVar5 = std::operator<<(poVar5,"    }\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"tesc",(allocator<char> *)&local_1c0);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_200,&local_240);
    glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_200);
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar2 & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0) {
    VVar1 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar5 = std::operator<<((ostream *)&src,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(triangles, equal_spacing, ccw) in;\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"in ");
    poVar5 = std::operator<<(poVar5,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar5 = std::operator<<(poVar5," gl_in[gl_MaxPatchVertices];\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"out ");
    poVar5 = std::operator<<(poVar5,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar5 = std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<(poVar5,"\n");
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_02);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"",&local_1cd);
    }
    poVar5 = std::operator<<(poVar5,(string *)local_200);
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_1ce);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      std::operator+(&local_240,&(this->m_caseDef).globalCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_1cf);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_240);
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    if (VVar1 == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) {
      std::operator+(&local_1c0,&(this->m_caseDef).mainCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1d0);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    poVar5 = std::operator<<(poVar5,"    vec3 p0 = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n");
    poVar5 = std::operator<<(poVar5,"    vec3 p1 = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n");
    poVar5 = std::operator<<(poVar5,"    vec3 p2 = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n");
    poVar5 = std::operator<<(poVar5,"    gl_Position = vec4(p0 + p1 + p2, 1.0);\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"tese",(allocator<char> *)&local_1c0);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_200,&local_240);
    glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_200);
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar2 & VK_SHADER_STAGE_GEOMETRY_BIT) != 0) {
    VVar1 = this->m_stage;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar5 = std::operator<<((ostream *)&src,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"layout(triangles) in;\n");
    poVar5 = std::operator<<(poVar5,"layout(triangle_strip, max_vertices = 3) out;\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"in ");
    poVar5 = std::operator<<(poVar5,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar5 = std::operator<<(poVar5," gl_in[];\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"out ");
    poVar5 = std::operator<<(poVar5,"gl_PerVertex {\n    vec4 gl_Position;\n}");
    poVar5 = std::operator<<(poVar5,";\n");
    poVar5 = std::operator<<(poVar5,"\n");
    if (VVar1 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
                ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
                 specConstants_03);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_200,"",&local_1d1);
    }
    poVar5 = std::operator<<(poVar5,(string *)local_200);
    if (VVar1 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"",&local_1d2);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    if (VVar1 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      std::operator+(&local_240,&(this->m_caseDef).globalCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"",&local_1d3);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_240);
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    if (VVar1 == VK_SHADER_STAGE_GEOMETRY_BIT) {
      std::operator+(&local_1c0,&(this->m_caseDef).mainCode,"\n");
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"",&local_1d4);
    }
    poVar5 = std::operator<<(poVar5,(string *)&local_1c0);
    poVar5 = std::operator<<(poVar5,"    gl_Position = gl_in[0].gl_Position;\n");
    poVar5 = std::operator<<(poVar5,"    EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    gl_Position = gl_in[1].gl_Position;\n");
    poVar5 = std::operator<<(poVar5,"    EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    gl_Position = gl_in[2].gl_Position;\n");
    poVar5 = std::operator<<(poVar5,"    EmitVertex();\n");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"    EndPrimitive();\n");
    std::operator<<(poVar5,"}\n");
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"geom",(allocator<char> *)&local_1c0);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    glu::GeometrySource::GeometrySource((GeometrySource *)local_200,&local_240);
    glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_200);
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  if ((VVar2 & VK_SHADER_STAGE_COMPUTE_BIT) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
    pcVar4 = glu::getGLSLVersionDeclaration(GLSL_VERSION_440);
    poVar5 = std::operator<<((ostream *)&src,pcVar4);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"\n");
    pipeline::(anonymous_namespace)::generateSpecConstantCode_abi_cxx11_
              ((string *)local_200,(_anonymous_namespace_ *)&(this->m_caseDef).specConstants,
               specConstants_04);
    poVar5 = std::operator<<(poVar5,(string *)local_200);
    generateSSBOCode(&local_220,&(this->m_caseDef).ssboCode);
    poVar5 = std::operator<<(poVar5,(string *)&local_220);
    std::operator+(&local_240,&(this->m_caseDef).globalCode,"\n");
    poVar5 = std::operator<<(poVar5,(string *)&local_240);
    poVar5 = std::operator<<(poVar5,"void main (void)\n");
    poVar5 = std::operator<<(poVar5,"{\n");
    poVar5 = std::operator<<(poVar5,(string *)&(this->m_caseDef).mainCode);
    std::operator<<(poVar5,"}\n");
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,"comp",(allocator<char> *)&local_1c0);
    pPVar6 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&programCollection->glslSources,&local_220);
    std::__cxx11::stringbuf::str();
    glu::ComputeSource::ComputeSource((ComputeSource *)local_200,&local_240);
    glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_200);
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
  }
  return;
}

Assistant:

void SpecConstantTest::initPrograms (SourceCollections& programCollection) const
{
	// Always add vertex and fragment to graphics stages
	VkShaderStageFlags requiredStages = m_stage;

	if (requiredStages & VK_SHADER_STAGE_ALL_GRAPHICS)
		requiredStages |= VK_SHADER_STAGE_VERTEX_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

	if (requiredStages & (VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT))
		requiredStages |= VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT | VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;

	// Either graphics or compute must be defined, but not both
	DE_ASSERT(((requiredStages & VK_SHADER_STAGE_ALL_GRAPHICS) != 0) != ((requiredStages & VK_SHADER_STAGE_COMPUTE_BIT) != 0));

	if (requiredStages & VK_SHADER_STAGE_VERTEX_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_VERTEX_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(location = 0) in highp vec4 position;\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_Position = position;\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_FRAGMENT_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_FRAGMENT_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(location = 0) out highp vec4 fragColor;\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    fragColor = vec4(1.0, 1.0, 0.0, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << " gl_out[];\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			<< "    if (gl_InvocationID == 0)\n"
			<< "    {\n"
			<< "        gl_TessLevelInner[0] = 3;\n"
			<< "        gl_TessLevelOuter[0] = 2;\n"
			<< "        gl_TessLevelOuter[1] = 2;\n"
			<< "        gl_TessLevelOuter[2] = 2;\n"
			<< "    }\n"
			<< "}\n";

		programCollection.glslSources.add("tesc") << glu::TessellationControlSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(triangles, equal_spacing, ccw) in;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[gl_MaxPatchVertices];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    vec3 p0 = gl_TessCoord.x * gl_in[0].gl_Position.xyz;\n"
			<< "    vec3 p1 = gl_TessCoord.y * gl_in[1].gl_Position.xyz;\n"
			<< "    vec3 p2 = gl_TessCoord.z * gl_in[2].gl_Position.xyz;\n"
			<< "    gl_Position = vec4(p0 + p1 + p2, 1.0);\n"
			<< "}\n";

		programCollection.glslSources.add("tese") << glu::TessellationEvaluationSource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_GEOMETRY_BIT)
	{
		const bool useSpecConst = (m_stage == VK_SHADER_STAGE_GEOMETRY_BIT);
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			<< "layout(triangles) in;\n"
			<< "layout(triangle_strip, max_vertices = 3) out;\n"
			<< "\n"
			<< "in " << s_perVertexBlock << " gl_in[];\n"
			<< "\n"
			<< "out " << s_perVertexBlock << ";\n"
			<< "\n"
			<< (useSpecConst ? generateSpecConstantCode(m_caseDef.specConstants) : "")
			<< (useSpecConst ? generateSSBOCode(m_caseDef.ssboCode) : "")
			<< (useSpecConst ? m_caseDef.globalCode + "\n" : "")
			<< "void main (void)\n"
			<< "{\n"
			<< (useSpecConst ? m_caseDef.mainCode + "\n" : "")
			<< "    gl_Position = gl_in[0].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[1].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    gl_Position = gl_in[2].gl_Position;\n"
			<< "    EmitVertex();\n"
			<< "\n"
			<< "    EndPrimitive();\n"
			<< "}\n";

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	if (requiredStages & VK_SHADER_STAGE_COMPUTE_BIT)
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_440) << "\n"
			// Don't define work group size, use the default or specialization constants
			<< "\n"
			<< generateSpecConstantCode(m_caseDef.specConstants)
			<< generateSSBOCode(m_caseDef.ssboCode)
			<< m_caseDef.globalCode + "\n"
			<< "void main (void)\n"
			<< "{\n"
			<< m_caseDef.mainCode
			<< "}\n";

		programCollection.glslSources.add("comp") << glu::ComputeSource(src.str());
	}
}